

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token * __thiscall enact::Lexer::string(Token *__return_storage_ptr__,Lexer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  size_type sVar3;
  ulong uVar4;
  col_t cVar5;
  ulong uVar6;
  bool bVar7;
  string value;
  long *local_80;
  long local_78;
  long local_70 [2];
  size_type *local_60;
  size_type local_58;
  undefined1 local_50;
  uint7 uStack_4f;
  undefined8 uStack_48;
  size_type *local_40;
  undefined8 local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  local_58 = 0;
  local_50 = 0;
  uVar6 = (this->m_source)._M_string_length;
  uVar4 = this->m_current;
  local_60 = (size_type *)&local_50;
  if (uVar4 < uVar6) {
    bVar7 = false;
    do {
      sVar3 = local_58;
      bVar2 = (this->m_source)._M_dataplus._M_p[uVar4];
      if (bVar7) {
        if (bVar2 < 0x6e) {
          if ((bVar2 != 0x22) && (bVar2 != 0x5c)) {
            if (bVar2 != 0x28) goto LAB_00115689;
            cVar5 = (short)*(undefined4 *)&this->m_col + 1;
            this->m_col = cVar5;
            this->m_current = uVar4 + 1;
            local_40 = &local_30;
            if (local_60 == (size_type *)&local_50) {
              uStack_28 = uStack_48;
              local_60 = local_40;
            }
            local_30 = CONCAT71(uStack_4f,local_50);
            local_58 = 0;
            local_50 = 0;
            this->m_currentInterpolations = this->m_currentInterpolations + 1;
            __return_storage_ptr__->type = INTERPOLATION;
            paVar1 = &(__return_storage_ptr__->lexeme).field_2;
            (__return_storage_ptr__->lexeme)._M_dataplus._M_p = (pointer)paVar1;
            if (local_60 == local_40) {
              paVar1->_M_allocated_capacity = local_30;
              *(undefined8 *)((long)&(__return_storage_ptr__->lexeme).field_2 + 8) = uStack_28;
            }
            else {
              (__return_storage_ptr__->lexeme)._M_dataplus._M_p = (pointer)local_60;
              (__return_storage_ptr__->lexeme).field_2._M_allocated_capacity = local_30;
            }
            (__return_storage_ptr__->lexeme)._M_string_length = sVar3;
            local_38 = 0;
            local_30 = (ulong)uStack_4f << 8;
            __return_storage_ptr__->line = this->m_line;
            __return_storage_ptr__->col = cVar5;
            local_60 = (size_type *)&local_50;
            goto LAB_0011562c;
          }
        }
        else if (((bVar2 != 0x6e) && (bVar2 != 0x72)) && (bVar2 != 0x74)) {
LAB_00115689:
          this->m_col = this->m_col + 1;
          this->m_current = uVar4 + 1;
          local_80 = local_70;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,"Unrecognised escape sequence.","");
          __return_storage_ptr__->type = ERROR;
          (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->lexeme).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->lexeme,local_80,local_78 + (long)local_80);
          goto LAB_00115605;
        }
LAB_00115553:
        std::__cxx11::string::push_back((char)&local_60);
        this->m_col = this->m_col + 1;
        uVar6 = (this->m_source)._M_string_length;
        uVar4 = this->m_current;
        bVar7 = false;
      }
      else {
        if (bVar2 != 0x5c) {
          if (bVar2 != 0x22) goto LAB_00115553;
          break;
        }
        this->m_col = this->m_col + 1;
        bVar7 = true;
      }
      uVar4 = uVar4 + 1;
      this->m_current = uVar4;
    } while (uVar4 < uVar6);
  }
  if (uVar4 < uVar6) {
    this->m_col = this->m_col + 1;
    this->m_current = uVar4 + 1;
    __return_storage_ptr__->type = STRING;
    (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->lexeme).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->lexeme,local_60,
               (undefined1 *)(local_58 + (long)local_60));
    __return_storage_ptr__->line = this->m_line;
    __return_storage_ptr__->col = this->m_col;
  }
  else {
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Unterminated string.","");
    __return_storage_ptr__->type = ERROR;
    (__return_storage_ptr__->lexeme)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->lexeme).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->lexeme,local_80,local_78 + (long)local_80);
LAB_00115605:
    __return_storage_ptr__->line = this->m_line;
    __return_storage_ptr__->col = this->m_col;
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
  }
LAB_0011562c:
  if (local_60 != (size_type *)&local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::string() {
        std::string value;
        bool inEscapeSequence = false;
        while (!isAtEnd()) {
            const char c = peek();

            if (inEscapeSequence) {
                switch (c) {
                    case 'n':
                        value.push_back('\n');
                        break;
                    case 'r':
                        value.push_back('\r');
                        break;
                    case 't':
                        value.push_back('\t');
                        break;
                    case '\\':
                        value.push_back('\\');
                        break;
                    case '"':
                        value.push_back('"');
                        break;
                    case '(':
                        // Eat the '('
                        advance();
                        return interpolationStart(std::move(value));
                    default:
                        advance();
                        return errorToken("Unrecognised escape sequence.");
                }

                inEscapeSequence = false;
            } else {
                if (c == '"') break;
                if (c == '\\') {
                    inEscapeSequence = true;
                    advance();
                    continue;
                }

                value.push_back(c);
            }

            advance();
        }

        if (isAtEnd()) {
            return errorToken("Unterminated string.");
        }

        // Eat the close quote.
        advance();

        return Token{TokenType::STRING, value, m_line, m_col};
    }